

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midl.c
# Opt level: O0

uint mdb_midl_search(MDB_IDL ids,MDB_ID id)

{
  uint uVar1;
  uint local_38;
  uint local_30;
  uint pivot;
  uint n;
  int val;
  uint cursor;
  uint base;
  MDB_ID id_local;
  MDB_IDL ids_local;
  
  val = 0;
  n = 1;
  pivot = 0;
  uVar1 = (uint)*ids;
  while( true ) {
    do {
      local_30 = uVar1;
      if (local_30 == 0) {
        if (0 < (int)pivot) {
          n = n + 1;
        }
        return n;
      }
      uVar1 = local_30 >> 1;
      n = val + uVar1 + 1;
      if (ids[n] < id) {
        local_38 = 0xffffffff;
      }
      else {
        local_38 = (uint)(id < ids[n]);
      }
      pivot = local_38;
    } while ((int)local_38 < 0);
    if ((int)local_38 < 1) break;
    uVar1 = local_30 - (uVar1 + 1);
    val = n;
  }
  return n;
}

Assistant:

unsigned mdb_midl_search( MDB_IDL ids, MDB_ID id )
{
	/*
	 * binary search of id in ids
	 * if found, returns position of id
	 * if not found, returns first position greater than id
	 */
	unsigned base = 0;
	unsigned cursor = 1;
	int val = 0;
	unsigned n = ids[0];

	while( 0 < n ) {
		unsigned pivot = n >> 1;
		cursor = base + pivot + 1;
		val = CMP( ids[cursor], id );

		if( val < 0 ) {
			n = pivot;

		} else if ( val > 0 ) {
			base = cursor;
			n -= pivot + 1;

		} else {
			return cursor;
		}
	}

	if( val > 0 ) {
		++cursor;
	}
	return cursor;
}